

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  FString *this_00;
  int iVar1;
  int iVar2;
  player_t *ppVar3;
  APlayerPawn *pAVar4;
  SBarInfo *pSVar5;
  char *pcVar6;
  PClass *pPVar7;
  char cVar8;
  int iVar9;
  AInventory *pAVar10;
  AAmmo *pAVar11;
  Node *pNVar12;
  undefined4 extraout_var;
  int iVar13;
  PClass *pPVar14;
  AInventory *pAVar15;
  long lVar16;
  BYTE *pBVar17;
  int iVar18;
  char cVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  
  if ((this->super_CommandDrawString).field_0x5f == '\x01') {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  iVar18 = (this->super_CommandDrawString).valueArgument;
  if (KEYS < this->value) goto LAB_005fc1c1;
  switch(this->value) {
  case HEALTH:
    iVar9 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    pSVar5 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    iVar18 = 0;
    if (0 < iVar9) {
      iVar18 = iVar9;
    }
    if (pSVar5->lowerHealthCap == false) {
      iVar18 = iVar9;
    }
    if (pSVar5->interpolateHealth == true) {
      iVar9 = pSVar5->interpolationSpeed;
LAB_005fc1b1:
      this->interpolationSpeed = iVar9;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      iVar18 = 0;
    }
    else {
      iVar18 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    pSVar5 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    if (pSVar5->interpolateArmor == true) {
      iVar9 = pSVar5->armorInterpolationSpeed;
      goto LAB_005fc1b1;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) goto LAB_005fc1f5;
    iVar18 = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) goto LAB_005fc1f5;
    iVar18 = statusBar->ammocount2;
    break;
  default:
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         this->inventoryItem,false);
    iVar18 = 0;
    if (pAVar10 != (AInventory *)0x0) {
LAB_005fbdca:
      iVar18 = pAVar10->Amount;
    }
    break;
  case AMMO1CAPACITY:
    pAVar11 = statusBar->ammo1;
    goto LAB_005fbfb1;
  case AMMO2CAPACITY:
    pAVar11 = statusBar->ammo2;
LAB_005fbfb1:
    if (pAVar11 == (AAmmo *)0x0) goto LAB_005fc1f5;
LAB_005fbff6:
    iVar18 = (pAVar11->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar11 = (AAmmo *)AActor::FindInventory
                                 (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                                  this->inventoryItem,false);
    if (pAVar11 == (AAmmo *)0x0) {
      pAVar11 = (AAmmo *)(this->inventoryItem->super_PClass).Defaults;
    }
    goto LAB_005fbff6;
  case FRAGS:
    iVar18 = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case KILLS:
    iVar18 = level.killed_monsters;
    break;
  case MONSTERS:
    iVar18 = level.total_monsters;
    break;
  case ITEMS:
    iVar18 = level.found_items;
    break;
  case TOTALITEMS:
    iVar18 = level.total_items;
    break;
  case SECRETS:
    iVar18 = level.found_secrets;
    break;
  case TOTALSECRETS:
    iVar18 = level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         (PClassActor *)AHexenArmor::RegistrationInfo.MyClass,false);
    if (pAVar10 == (AInventory *)0x0) {
      dVar22 = 0.0;
    }
    else {
      dVar22 = (double)pAVar10[1].super_AActor.super_DThinker.super_DObject._vptr_DObject +
               (double)pAVar10[1].super_AActor.super_DThinker.super_DObject.Class +
               (double)pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext +
               (double)pAVar10[1].super_AActor.super_DThinker.super_DObject.GCNext +
               *(double *)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjectFlags;
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      dVar22 = dVar22 + statusBar->armor->SavePercent * 100.0;
    }
    if (this->value == ARMORCLASS) {
      dVar22 = dVar22 / 5.0;
    }
    iVar18 = (int)dVar22;
    break;
  case GLOBALVAR:
    iVar18 = ACS_GlobalVars[iVar18];
    break;
  case GLOBALARRAY:
    pNVar12 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::GetNode
                        (ACS_GlobalArrays + iVar18,consoleplayer);
    iVar18 = (pNVar12->Pair).Value;
    break;
  case POWERUPTIME:
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         *(PClassActor **)((this->inventoryItem->super_PClass).Defaults + 0x4e0),
                         false);
    if (pAVar10 != (AInventory *)0x0) {
      iVar18 = *(int *)&pAVar10->field_0x4dc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    ppVar3 = (statusBar->super_DBaseStatusBar).CPlayer;
    if ((ppVar3->mo->super_AActor).waterlevel < 3) {
      iVar18 = level.airsupply / 0x23;
    }
    else {
      iVar18 = ppVar3->air_finished - level.time;
      iVar18 = iVar18 + (int)((ulong)((long)(iVar18 + 0x22) * -0x15f15f15) >> 0x20) + 0x22;
      iVar9 = (iVar18 >> 5) - (iVar18 >> 0x1f);
      iVar18 = 0;
      if (0 < iVar9) {
        iVar18 = iVar9;
      }
    }
    break;
  case SELECTEDINVENTORY:
    pAVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar10 = (pAVar4->InvSel).field_0.p;
    if (pAVar10 != (AInventory *)0x0) {
      if (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar10 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel).field_0.p;
        goto LAB_005fbdca;
      }
      (pAVar4->InvSel).field_0.p = (AInventory *)0x0;
    }
    break;
  case SCORE:
    iVar18 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    iVar18 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    iVar18 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    pAVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar10 = (pAVar4->super_AActor).Inventory.field_0.p;
    if ((pAVar10 != (AInventory *)0x0) &&
       (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar4->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar10 = (AInventory *)0x0;
    }
    iVar18 = 0;
    pPVar7 = AKey::RegistrationInfo.MyClass;
    while (AKey::RegistrationInfo.MyClass = pPVar7, pAVar10 != (AInventory *)0x0) {
      if ((pAVar10->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar9 = (**(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar10);
        (pAVar10->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar9);
      }
      pPVar14 = (pAVar10->super_AActor).super_DThinker.super_DObject.Class;
      bVar20 = pPVar14 != (PClass *)0x0;
      if (pPVar14 != pPVar7 && bVar20) {
        do {
          pPVar14 = pPVar14->ParentClass;
          bVar20 = pPVar14 != (PClass *)0x0;
          if (pPVar14 == pPVar7) break;
        } while (pPVar14 != (PClass *)0x0);
      }
      pAVar15 = (pAVar10->super_AActor).Inventory.field_0.p;
      if ((pAVar15 != (AInventory *)0x0) &&
         (((pAVar15->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar10->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar15 = (AInventory *)0x0;
      }
      iVar18 = iVar18 + (uint)bVar20;
      pAVar10 = pAVar15;
      pPVar7 = AKey::RegistrationInfo.MyClass;
    }
  }
LAB_005fc1c1:
  iVar9 = this->interpolationSpeed;
  if ((iVar9 == 0) || ((hudChanged && (level.time != 1)))) {
    this->drawValue = iVar18;
  }
  else {
    iVar1 = this->drawValue;
    if (iVar18 < iVar1) {
      iVar18 = iVar1 - iVar18 >> 2;
      if (iVar18 < iVar9) {
        iVar9 = iVar18;
      }
      iVar13 = 1;
      if (1 < iVar18) {
        iVar13 = iVar9;
      }
      this->drawValue = iVar1 - iVar13;
    }
    else if (iVar18 - iVar1 != 0 && iVar1 <= iVar18) {
      iVar18 = iVar18 - iVar1 >> 2;
      if (iVar18 < iVar9) {
        iVar9 = iVar18;
      }
      iVar13 = 1;
      if (1 < iVar18) {
        iVar13 = iVar9;
      }
      this->drawValue = iVar13 + iVar1;
    }
  }
  iVar18 = this->drawValue;
  if ((iVar18 == 0 & (this->super_CommandDrawString).field_0x5d) == 1) {
LAB_005fc1f5:
    FString::operator=(&(this->super_CommandDrawString).str,(char *)"");
    return;
  }
  iVar9 = this->lowValue;
  (this->super_CommandDrawString).translation = this->normalTranslation;
  lVar16 = 0x70;
  if ((iVar18 <= iVar9 && iVar9 != -1) ||
     (lVar16 = 0x78, this->highValue <= iVar18 && this->highValue != -1)) {
    (this->super_CommandDrawString).translation =
         *(EColorRange *)
          ((long)&(this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand +
          lVar16);
  }
  cVar19 = (this->super_CommandDrawString).field_0x5c;
  iVar9 = this->length;
  if ((this->super_CommandDrawString).field_0x5e == '\0') {
    iVar18 = 0x7fffffff;
    if (iVar9 < 10) {
      dVar22 = pow(10.0,(double)iVar9);
      dVar22 = ceil(dVar22);
      iVar18 = (int)dVar22 + -1;
    }
    iVar9 = iVar18;
    if (((this->super_CommandDrawString).field_0x5c == '\x01') && (iVar1 = this->length, iVar1 != 1)
       ) {
      iVar2 = this->drawValue;
      iVar13 = -0x80000000;
      if (iVar1 < 10) {
        dVar22 = pow(10.0,(double)(iVar1 + -1));
        dVar22 = ceil(dVar22);
        iVar13 = (int)-(dVar22 + -1.0);
      }
      if (iVar2 < iVar18) {
        iVar9 = iVar2;
      }
      bVar21 = SBORROW4(iVar2,iVar13);
      iVar18 = iVar2 - iVar13;
      bVar20 = iVar2 == iVar13;
    }
    else {
      iVar1 = this->drawValue;
      iVar13 = -iVar18;
      if (iVar1 < iVar18) {
        iVar9 = iVar1;
      }
      bVar21 = SBORROW4(iVar1,iVar13);
      iVar18 = iVar1 + iVar18;
      bVar20 = iVar1 == iVar13;
    }
    if (bVar20 || bVar21 != iVar18 < 0) {
      iVar9 = iVar13;
    }
  }
  else {
    if (9 < iVar9) goto LAB_005fc39f;
    dVar22 = pow(10.0,(double)(int)(iVar9 - (uint)(iVar18 < 0 && 1 < iVar9)));
    dVar22 = ceil(dVar22);
    cVar8 = '\x01';
    if (this->drawValue < (int)dVar22) {
      cVar8 = cVar19;
    }
    cVar19 = cVar8;
    iVar9 = this->drawValue % (int)dVar22;
  }
  this->drawValue = iVar9;
LAB_005fc39f:
  if ((this->super_CommandDrawString).field_0x5f == '\0') {
    pBVar17 = "";
  }
  else {
    pBVar17 = (BYTE *)(this->super_CommandDrawString).str.Chars;
  }
  this_00 = &(this->super_CommandDrawString).str;
  pcVar6 = (this->prefixPadding).Chars;
  if (cVar19 == '\0') {
    FString::Format(this_00,"%s%s%d",pBVar17,pcVar6,(ulong)(uint)this->drawValue);
  }
  else {
    FString::Format(this_00,"%s%s%0*d",pBVar17,pcVar6,
                    (ulong)(uint)((this->drawValue >> 0x1f) + this->length));
  }
  CommandDrawString::RealignString(&this->super_CommandDrawString);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}